

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O2

RunResult __thiscall wabt::interp::Thread::DoTableSet(Thread *this,Instr instr,Ptr *out_trap)

{
  Store *store;
  Result RVar1;
  u64 uVar2;
  RunResult RVar3;
  Value VVar4;
  Ptr table;
  Ptr local_68;
  string local_50;
  
  RefPtr<wabt::interp::Table>::RefPtr
            (&table,this->store_,
             (Ref)(this->inst_->tables_).
                  super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
                  super__Vector_impl_data._M_start[instr.field_2.imm_u32].index);
  VVar4 = Pop(this);
  uVar2 = PopPtr(this,&table);
  RVar1 = Table::Set(table.obj_,this->store_,(u32)uVar2,VVar4.field_0.ref_.index);
  RVar3 = Ok;
  if (RVar1.enum_ == Error) {
    store = this->store_;
    StringPrintf_abi_cxx11_
              (&local_50,"out of bounds table access: table.set at %lu >= max value %u",uVar2,
               (ulong)((long)((table.obj_)->elements_).
                             super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                      (long)((table.obj_)->elements_).
                            super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>
                            ._M_impl.super__Vector_impl_data._M_start) >> 3);
    Trap::New(&local_68,store,&local_50,&this->frames_);
    out_trap->obj_ = local_68.obj_;
    out_trap->store_ = local_68.store_;
    out_trap->root_index_ = local_68.root_index_;
    local_68.obj_ = (Trap *)0x0;
    local_68.store_ = (Store *)0x0;
    local_68.root_index_ = 0;
    RefPtr<wabt::interp::Trap>::reset(&local_68);
    std::__cxx11::string::_M_dispose();
    RVar3 = Trap;
  }
  RefPtr<wabt::interp::Table>::reset(&table);
  return RVar3;
}

Assistant:

RunResult Thread::DoTableSet(Instr instr, Trap::Ptr* out_trap) {
  Table::Ptr table{store_, inst_->tables()[instr.imm_u32]};
  auto ref = Pop<Ref>();
  u64 index = PopPtr(table);
  TRAP_IF(Failed(table->Set(store_, index, ref)),
          StringPrintf("out of bounds table access: table.set at %" PRIu64
                       " >= max value %u",
                       index, table->size()));
  return RunResult::Ok;
}